

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QObject*,QPointer<QHttp2Stream>>::emplace_helper<QPointer<QHttp2Stream>>
          (QHash<QObject_*,_QPointer<QHttp2Stream>_> *this,QObject **key,
          QPointer<QHttp2Stream> *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  iterator<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *in_RDX;
  Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QObject*,QPointer<QHttp2Stream>>>::findOrInsert<QObject*>
            (in_RSI,(QObject **)in_RDX);
  QHashPrivate::iterator<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_>::node(in_RDX);
  QHashPrivate::Node<QObject*,QPointer<QHttp2Stream>>::createInPlace<QPointer<QHttp2Stream>>
            ((Node<QObject_*,_QPointer<QHttp2Stream>_> *)in_stack_ffffffffffffff90,
             (QObject **)in_stack_ffffffffffffff88,(QPointer<QHttp2Stream> *)0x2e0c53);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<QObject_*,_QPointer<QHttp2Stream>_>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }